

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RandomDropFilterOperation::RandomDropFilterOperation(RandomDropFilterOperation *this)

{
  FilterOperations *in_RDI;
  anon_class_8_1_8991fb9c *in_stack_00000008;
  atomic<double> *in_stack_ffffffffffffffe0;
  
  FilterOperations::FilterOperations(in_RDI);
  in_RDI->_vptr_FilterOperations = (_func_int **)&PTR__RandomDropFilterOperation_00a655b0;
  std::atomic<double>::atomic(in_stack_ffffffffffffffe0,(double)in_RDI);
  std::
  make_shared<helics::MessageConditionalOperator,helics::RandomDropFilterOperation::RandomDropFilterOperation()::__0>
            (in_stack_00000008);
  return;
}

Assistant:

RandomDropFilterOperation::RandomDropFilterOperation():
    tcond(std::make_shared<MessageConditionalOperator>([this](const Message* /*unused*/) {
        return (randDouble(RandomDistributions::BERNOULLI, (1.0 - dropProb), 1.0) > 0.1);
    }))
{
}